

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_LadderDatabase.cpp
# Opt level: O2

void __thiscall
RenX::LadderDatabase::updateLadder(LadderDatabase *this,Server *server,TeamType *team)

{
  int *piVar1;
  long *plVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  _List_node_base *p_Var6;
  undefined4 uVar7;
  undefined4 uVar8;
  TeamType TVar9;
  size_t sVar10;
  int iVar11;
  int iVar12;
  PlayerInfo *player;
  uint uVar13;
  int iVar14;
  size_t sVar15;
  Entry *entry;
  ulong uVar16;
  milliseconds mVar17;
  time_t tVar18;
  ostream *poVar19;
  size_t in_RCX;
  void *__buf;
  long lVar20;
  _List_node_base *p_Var21;
  long lVar22;
  long lVar23;
  long lVar24;
  string_view msg;
  long local_b8;
  long local_b0;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  string str;
  
  sVar10 = (server->players).super__List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>.
           _M_impl._M_node._M_size;
  sVar15 = Server::getBotCount(server);
  if (sVar10 != sVar15) {
    if (this->OnPreUpdateLadder != (PreUpdateLadderFunction *)0x0) {
      (*this->OnPreUpdateLadder)(this,server,team);
    }
    p_Var21 = (_List_node_base *)&server->players;
    while (p_Var21 = (((_List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)
                      &p_Var21->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var21 != (_List_node_base *)&server->players) {
      if ((p_Var21[0xf]._M_prev != (_List_node_base *)0x0) &&
         (((ulong)p_Var21[0x10]._M_next & 0x400000000) == 0)) {
        entry = getPlayerEntry(this,(uint64_t)p_Var21[0xf]._M_prev);
        if (entry == (Entry *)0x0) {
          entry = (Entry *)operator_new(0x140);
          memset(entry,0,0x130);
          (entry->most_recent_name)._M_dataplus._M_p = (pointer)&(entry->most_recent_name).field_2;
          (entry->most_recent_name).field_2._M_local_buf[0] = '\0';
          entry->next = (Entry *)0x0;
          entry->prev = (Entry *)0x0;
          append(this,entry);
          entry->steam_id = (uint64_t)p_Var21[0xf]._M_prev;
        }
        uVar16 = (ulong)*(double *)((long)(p_Var21 + 0x10 + 1) + 8);
        entry->total_score =
             entry->total_score +
             ((long)(*(double *)((long)(p_Var21 + 0x10 + 1) + 8) - 9.223372036854776e+18) &
              (long)uVar16 >> 0x3f | uVar16);
        player = (PlayerInfo *)(p_Var21 + 1);
        uVar5 = *(undefined8 *)((long)(p_Var21 + 0x13 + 1) + 4);
        p_Var6 = p_Var21[0x13]._M_prev;
        entry->total_kills = (int)p_Var6 + entry->total_kills;
        entry->total_deaths = (int)((ulong)p_Var6 >> 0x20) + entry->total_deaths;
        entry->total_headshot_kills = (int)uVar5 + entry->total_headshot_kills;
        entry->total_vehicle_kills = (int)((ulong)uVar5 >> 0x20) + entry->total_vehicle_kills;
        uVar5 = *(undefined8 *)((long)(p_Var21 + 0x13 + 1) + 0xc);
        uVar3 = entry->total_building_kills;
        uVar7 = entry->total_defence_kills;
        entry->total_building_kills = uVar3 + (int)uVar5;
        entry->total_defence_kills = uVar7 + (int)((ulong)uVar5 >> 0x20);
        entry->total_captures = entry->total_captures + *(int *)((long)&p_Var21[0x16]._M_prev + 4);
        mVar17 = Server::getGameTime(server,player);
        iVar14 = *(int *)&p_Var21[0x16]._M_next;
        iVar11 = *(int *)((long)&p_Var21[0x16]._M_next + 4);
        iVar12 = *(int *)&p_Var21[0x16]._M_prev;
        entry->total_beacon_placements =
             entry->total_beacon_placements + *(int *)((long)&p_Var21[0x15]._M_prev + 4);
        entry->total_beacon_disarms = entry->total_beacon_disarms + iVar14;
        entry->total_proxy_placements = entry->total_proxy_placements + iVar11;
        entry->total_proxy_disarms = entry->total_proxy_disarms + iVar12;
        uVar4 = entry->total_game_time;
        uVar8 = entry->total_games;
        entry->total_game_time = uVar4 + (int)(mVar17.__r / 1000);
        entry->total_games = uVar8 + 1;
        TVar9 = *(TeamType *)&p_Var21[0x10]._M_prev;
        if (TVar9 == Nod) {
          entry->total_nod_games = entry->total_nod_games + 1;
          if (*team == None) {
            entry->total_nod_ties = entry->total_nod_ties + 1;
          }
          else if (*team == Nod) {
            entry->total_wins = entry->total_wins + 1;
            entry->total_nod_wins = entry->total_nod_wins + 1;
          }
          local_78 = 0xcc;
          local_80 = 200;
          local_88 = 0xc4;
          local_90 = 0xc0;
          local_98 = 0xbc;
          local_a0 = 0xb8;
          local_b0 = 0x20;
          local_b8 = 0xa8;
          lVar22 = 0xb0;
          lVar23 = 0xb4;
          lVar24 = 0xac;
          lVar20 = 0xa4;
LAB_00132a22:
          mVar17 = Server::getGameTime(server,player);
          piVar1 = (int *)((long)&entry->rank + lVar20);
          *piVar1 = *piVar1 + (int)(mVar17.__r / 1000);
          uVar16 = (ulong)*(double *)((long)(p_Var21 + 0x10 + 1) + 8);
          plVar2 = (long *)((long)&entry->rank + local_b0);
          *plVar2 = *plVar2 + ((long)(*(double *)((long)(p_Var21 + 0x10 + 1) + 8) -
                                     9.223372036854776e+18) & (long)uVar16 >> 0x3f | uVar16);
          piVar1 = (int *)((long)&entry->rank + local_b8);
          *piVar1 = *piVar1 + *(int *)((long)&p_Var21[0x15]._M_prev + 4);
          piVar1 = (int *)((long)&entry->rank + lVar24);
          *piVar1 = *piVar1 + *(int *)&p_Var21[0x16]._M_next;
          piVar1 = (int *)((long)&entry->rank + lVar22);
          *piVar1 = *piVar1 + *(int *)((long)&p_Var21[0x16]._M_next + 4);
          piVar1 = (int *)((long)&entry->rank + lVar23);
          *piVar1 = *piVar1 + *(int *)&p_Var21[0x16]._M_prev;
          piVar1 = (int *)((long)&entry->rank + local_a0);
          *piVar1 = *piVar1 + *(int *)&p_Var21[0x13]._M_prev;
          piVar1 = (int *)((long)&entry->rank + local_98);
          *piVar1 = *piVar1 + *(int *)((long)&p_Var21[0x13]._M_prev + 4);
          piVar1 = (int *)((long)&entry->rank + local_90);
          *piVar1 = *piVar1 + *(int *)((long)(p_Var21 + 0x13 + 1) + 8);
          piVar1 = (int *)((long)&entry->rank + local_88);
          *piVar1 = *piVar1 + *(int *)&p_Var21[0x15]._M_next;
          piVar1 = (int *)((long)&entry->rank + local_80);
          *piVar1 = *piVar1 + *(int *)((long)(p_Var21 + 0x13 + 1) + 0xc);
          iVar14 = *(int *)((long)(p_Var21 + 0x13 + 1) + 4);
LAB_00132afb:
          piVar1 = (int *)((long)&entry->rank + local_78);
          *piVar1 = *piVar1 + iVar14;
        }
        else {
          if (TVar9 == GDI) {
            entry->total_gdi_games = entry->total_gdi_games + 1;
            if (*team == None) {
              entry->total_gdi_ties = entry->total_gdi_ties + 1;
            }
            else if (*team == GDI) {
              entry->total_wins = entry->total_wins + 1;
              entry->total_gdi_wins = entry->total_gdi_wins + 1;
            }
            local_78 = 0x94;
            local_80 = 0x90;
            local_88 = 0x8c;
            local_90 = 0x88;
            local_98 = 0x84;
            local_a0 = 0x80;
            lVar20 = 0x6c;
            local_b0 = 0x18;
            local_b8 = 0x70;
            lVar24 = 0x74;
            lVar22 = 0x78;
            lVar23 = 0x7c;
            goto LAB_00132a22;
          }
          local_78 = 0x4c;
          iVar14 = 1;
          if (TVar9 == *team) goto LAB_00132afb;
        }
        uVar13 = (uint)(long)*(double *)((long)(p_Var21 + 0x10 + 1) + 8);
        if (entry->top_score < uVar13) {
          entry->top_score = uVar13;
        }
        if (entry->top_kills < *(uint *)&p_Var21[0x13]._M_prev) {
          entry->top_kills = *(uint *)&p_Var21[0x13]._M_prev;
        }
        uVar13 = *(uint *)((long)&p_Var21[0x13]._M_prev + 4);
        if (entry->most_deaths < uVar13) {
          entry->most_deaths = uVar13;
        }
        if (entry->top_headshot_kills < *(uint *)((long)(p_Var21 + 0x13 + 1) + 4)) {
          entry->top_headshot_kills = *(uint *)((long)(p_Var21 + 0x13 + 1) + 4);
        }
        if (entry->top_vehicle_kills < *(uint *)((long)(p_Var21 + 0x13 + 1) + 8)) {
          entry->top_vehicle_kills = *(uint *)((long)(p_Var21 + 0x13 + 1) + 8);
        }
        if (entry->top_building_kills < *(uint *)((long)(p_Var21 + 0x13 + 1) + 0xc)) {
          entry->top_building_kills = *(uint *)((long)(p_Var21 + 0x13 + 1) + 0xc);
        }
        if (entry->top_defence_kills < *(uint *)&p_Var21[0x15]._M_next) {
          entry->top_defence_kills = *(uint *)&p_Var21[0x15]._M_next;
        }
        uVar13 = *(uint *)((long)&p_Var21[0x16]._M_prev + 4);
        if (entry->top_captures < uVar13) {
          entry->top_captures = uVar13;
        }
        mVar17 = Server::getGameTime(server,player);
        in_RCX = 1000;
        uVar13 = (uint)(mVar17.__r / 1000);
        if (entry->top_game_time < uVar13) {
          entry->top_game_time = uVar13;
        }
        uVar13 = *(uint *)((long)&p_Var21[0x15]._M_prev + 4);
        if (entry->top_beacon_placements < uVar13) {
          entry->top_beacon_placements = uVar13;
        }
        if (entry->top_beacon_disarms < *(uint *)&p_Var21[0x16]._M_next) {
          entry->top_beacon_disarms = *(uint *)&p_Var21[0x16]._M_next;
        }
        uVar13 = *(uint *)((long)&p_Var21[0x16]._M_next + 4);
        if (entry->top_proxy_placements < uVar13) {
          entry->top_proxy_placements = uVar13;
        }
        if (entry->top_proxy_disarms < *(uint *)&p_Var21[0x16]._M_prev) {
          entry->top_proxy_disarms = *(uint *)&p_Var21[0x16]._M_prev;
        }
        entry->most_recent_ip = *(uint32_t *)&p_Var21[0x10]._M_next;
        tVar18 = time((time_t *)0x0);
        entry->last_game = tVar18;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&entry->most_recent_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &p_Var21[1]._M_prev);
      }
    }
    lVar20 = std::chrono::_V2::steady_clock::now();
    sort_entries(this);
    lVar24 = std::chrono::_V2::steady_clock::now();
    lVar22 = std::chrono::_V2::steady_clock::now();
    iVar14 = Jupiter::Database::getFilename_abi_cxx11_();
    write(this,iVar14,__buf,in_RCX);
    lVar23 = std::chrono::_V2::steady_clock::now();
    if (this->m_output_times != false) {
      string_printf_abi_cxx11_
                (&str,
                 "Ladder: %zu entries sorted in %f seconds; Database written in %f seconds.\r\n",
                 (double)(lVar24 - lVar20) * 1e-09,(double)(lVar23 - lVar22) * 1e-09,this->m_entries
                );
      poVar19 = std::operator<<((ostream *)&std::cout,(string *)&str);
      std::endl<char,std::char_traits<char>>(poVar19);
      msg._M_str = str._M_dataplus._M_p;
      msg._M_len = str._M_string_length;
      Server::sendLogChan(server,msg);
      std::__cxx11::string::~string((string *)&str);
    }
  }
  return;
}

Assistant:

void RenX::LadderDatabase::updateLadder(RenX::Server &server, const RenX::TeamType &team) {
	if (server.players.size() != server.getBotCount()) {
		// call the PreUpdateLadder event
		if (this->OnPreUpdateLadder != nullptr) {
			this->OnPreUpdateLadder(*this, server, team);
		}

		// update player stats in memory
		Entry *entry;
		for (auto player = server.players.begin(); player != server.players.end(); ++player) {
			if (player->steamid != 0 && (player->ban_flags & RenX::BanDatabase::Entry::FLAG_TYPE_LADDER) == 0) {
				entry = getPlayerEntry(player->steamid);
				if (entry == nullptr) {
					entry = new Entry();
					append(entry);
					entry->steam_id = player->steamid;
				}

				entry->total_score += static_cast<uint64_t>(player->score);

				entry->total_kills += player->kills;
				entry->total_deaths += player->deaths;
				entry->total_headshot_kills += player->headshots;
				entry->total_vehicle_kills += player->vehicleKills;
				entry->total_building_kills += player->buildingKills;
				entry->total_defence_kills += player->defenceKills;
				entry->total_captures += player->captures;
				entry->total_game_time += static_cast<uint32_t>(std::chrono::duration_cast<std::chrono::seconds>(server.getGameTime(*player)).count());
				entry->total_beacon_placements += player->beaconPlacements;
				entry->total_beacon_disarms += player->beaconDisarms;
				entry->total_proxy_placements += player->proxy_placements;
				entry->total_proxy_disarms += player->proxy_disarms;

				++entry->total_games;
				switch (player->team) {
				case RenX::TeamType::GDI:
					++entry->total_gdi_games;
					if (player->team == team)
						++entry->total_wins, ++entry->total_gdi_wins;
					else if (team == RenX::TeamType::None)
						++entry->total_gdi_ties;

					entry->total_gdi_game_time += static_cast<uint32_t>(std::chrono::duration_cast<std::chrono::seconds>(server.getGameTime(*player)).count());
					entry->total_gdi_score += static_cast<uint64_t>(player->score);
					entry->total_gdi_beacon_placements += player->beaconPlacements;
					entry->total_gdi_beacon_disarms += player->beaconDisarms;
					entry->total_gdi_proxy_placements += player->proxy_placements;
					entry->total_gdi_proxy_disarms += player->proxy_disarms;
					entry->total_gdi_kills += player->kills;
					entry->total_gdi_deaths += player->deaths;
					entry->total_gdi_vehicle_kills += player->vehicleKills;
					entry->total_gdi_defence_kills += player->defenceKills;
					entry->total_gdi_building_kills += player->buildingKills;
					entry->total_gdi_headshots += player->headshots;
					break;
				case RenX::TeamType::Nod:
					++entry->total_nod_games;
					if (player->team == team)
						++entry->total_wins, ++entry->total_nod_wins;
					else if (team == RenX::TeamType::None)
						++entry->total_nod_ties;

					entry->total_nod_game_time += static_cast<uint32_t>(std::chrono::duration_cast<std::chrono::seconds>(server.getGameTime(*player)).count());
					entry->total_nod_score += static_cast<uint64_t>(player->score);
					entry->total_nod_beacon_placements += player->beaconPlacements;
					entry->total_nod_beacon_disarms += player->beaconDisarms;
					entry->total_nod_proxy_placements += player->proxy_placements;
					entry->total_nod_proxy_disarms += player->proxy_disarms;
					entry->total_nod_kills += player->kills;
					entry->total_nod_deaths += player->deaths;
					entry->total_nod_vehicle_kills += player->vehicleKills;
					entry->total_nod_defence_kills += player->defenceKills;
					entry->total_nod_building_kills += player->buildingKills;
					entry->total_nod_headshots += player->headshots;
					break;
				default:
					if (player->team == team)
						++entry->total_wins;
					break;
				}

				auto set_if_greater = [](uint32_t &src, const uint32_t &cmp) {
					if (cmp > src) {
						src = cmp;
					}
				};

				set_if_greater(entry->top_score, static_cast<uint32_t>(player->score));
				set_if_greater(entry->top_kills, player->kills);
				set_if_greater(entry->most_deaths, player->deaths);
				set_if_greater(entry->top_headshot_kills, player->headshots);
				set_if_greater(entry->top_vehicle_kills, player->vehicleKills);
				set_if_greater(entry->top_building_kills, player->buildingKills);
				set_if_greater(entry->top_defence_kills, player->defenceKills);
				set_if_greater(entry->top_captures, player->captures);
				set_if_greater(entry->top_game_time, static_cast<uint32_t>(std::chrono::duration_cast<std::chrono::seconds>(server.getGameTime(*player)).count()));
				set_if_greater(entry->top_beacon_placements, player->beaconPlacements);
				set_if_greater(entry->top_beacon_disarms, player->beaconDisarms);
				set_if_greater(entry->top_proxy_placements, player->proxy_placements);
				set_if_greater(entry->top_proxy_disarms, player->proxy_disarms);

				entry->most_recent_ip = player->ip32;
				entry->last_game = time(nullptr);
				entry->most_recent_name = player->name;
			}
		}

		// sort new stats
		std::chrono::steady_clock::time_point start_time = std::chrono::steady_clock::now();
		sort_entries();
		std::chrono::steady_clock::duration sort_duration = std::chrono::steady_clock::now() - start_time;

		// write new stats
		start_time = std::chrono::steady_clock::now();
		write(this->getFilename());
		std::chrono::steady_clock::duration write_duration = std::chrono::steady_clock::now() - start_time;

		if (m_output_times)
		{
			std::string str = string_printf("Ladder: %zu entries sorted in %f seconds; Database written in %f seconds." ENDL,
				getEntries(),
				static_cast<double>(sort_duration.count()) * (static_cast<double>(std::chrono::steady_clock::duration::period::num) / static_cast<double>(std::chrono::steady_clock::duration::period::den) * static_cast<double>(std::chrono::seconds::duration::period::den / std::chrono::seconds::duration::period::num)),
				static_cast<double>(write_duration.count()) * (static_cast<double>(std::chrono::steady_clock::duration::period::num) / static_cast<double>(std::chrono::steady_clock::duration::period::den) * static_cast<double>(std::chrono::seconds::duration::period::den / std::chrono::seconds::duration::period::num)));
			std::cout << str << std::endl;
			server.sendLogChan(str);
		}
	}
}